

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

void Abc_NtkPrintStrSupports(Abc_Ntk_t *pNtk,int fMatrix)

{
  Vec_Ptr_t *pVVar1;
  Vec_Ptr_t *__ptr;
  char *pcVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_40;
  int local_34;
  
  local_34 = fMatrix;
  puts("Structural support info:");
  pVVar1 = pNtk->vCos;
  if (0 < pVVar1->nSize) {
    uVar5 = 0;
    do {
      local_40 = (Abc_Obj_t *)pVVar1->pArray[uVar5];
      pVVar1 = Abc_NtkNodeSupport(pNtk,&local_40,1);
      __ptr = Abc_NtkDfsNodes(pNtk,&local_40,1);
      uVar6 = 0;
      if (0 < (long)pVVar1->nSize) {
        lVar4 = 0;
        uVar6 = 0;
        do {
          uVar6 = uVar6 + ((*(uint *)((long)pVVar1->pArray[lVar4] + 0x14) & 0xf) == 2);
          lVar4 = lVar4 + 1;
        } while (pVVar1->nSize != lVar4);
      }
      pcVar2 = Abc_ObjName(local_40);
      printf("%5d  %20s :  Cone = %5d.  Supp = %5d. (PIs = %5d. FFs = %5d.)\n",uVar5 & 0xffffffff,
             pcVar2,(ulong)(uint)__ptr->nSize,(ulong)(uint)pVVar1->nSize,(ulong)uVar6,
             pVVar1->nSize - uVar6);
      if (__ptr->pArray != (void **)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (void **)0x0;
      }
      if (__ptr != (Vec_Ptr_t *)0x0) {
        free(__ptr);
      }
      if (pVVar1->pArray != (void **)0x0) {
        free(pVVar1->pArray);
        pVVar1->pArray = (void **)0x0;
      }
      if (pVVar1 != (Vec_Ptr_t *)0x0) {
        free(pVVar1);
      }
      uVar5 = uVar5 + 1;
      pVVar1 = pNtk->vCos;
    } while ((long)uVar5 < (long)pVVar1->nSize);
  }
  if (local_34 != 0) {
    pVVar1 = pNtk->vCis;
    if (0 < pVVar1->nSize) {
      lVar4 = 0;
      do {
        local_40 = (Abc_Obj_t *)pVVar1->pArray[lVar4];
        local_40->field_0x14 = local_40->field_0x14 & 0xef;
        lVar4 = lVar4 + 1;
        pVVar1 = pNtk->vCis;
      } while (lVar4 < pVVar1->nSize);
    }
    puts("Actual support info:");
    pVVar1 = pNtk->vCos;
    if (0 < pVVar1->nSize) {
      lVar4 = 0;
      do {
        local_40 = (Abc_Obj_t *)pVVar1->pArray[lVar4];
        pVVar1 = Abc_NtkNodeSupport(pNtk,&local_40,1);
        if (0 < pVVar1->nSize) {
          lVar3 = 0;
          do {
            local_40 = (Abc_Obj_t *)pVVar1->pArray[lVar3];
            local_40->field_0x14 = local_40->field_0x14 | 0x10;
            lVar3 = lVar3 + 1;
          } while (lVar3 < pVVar1->nSize);
        }
        if (pVVar1->pArray != (void **)0x0) {
          free(pVVar1->pArray);
          pVVar1->pArray = (void **)0x0;
        }
        if (pVVar1 != (Vec_Ptr_t *)0x0) {
          free(pVVar1);
        }
        pVVar1 = pNtk->vCis;
        if (0 < pVVar1->nSize) {
          lVar3 = 0;
          do {
            local_40 = (Abc_Obj_t *)pVVar1->pArray[lVar3];
            printf("%d",(ulong)(*(uint *)&local_40->field_0x14 >> 4 & 1));
            lVar3 = lVar3 + 1;
            pVVar1 = pNtk->vCis;
          } while (lVar3 < pVVar1->nSize);
        }
        putchar(10);
        pVVar1 = pNtk->vCis;
        if (0 < pVVar1->nSize) {
          lVar3 = 0;
          do {
            local_40 = (Abc_Obj_t *)pVVar1->pArray[lVar3];
            local_40->field_0x14 = local_40->field_0x14 & 0xef;
            lVar3 = lVar3 + 1;
            pVVar1 = pNtk->vCis;
          } while (lVar3 < pVVar1->nSize);
        }
        lVar4 = lVar4 + 1;
        pVVar1 = pNtk->vCos;
      } while (lVar4 < pVVar1->nSize);
    }
  }
  Abc_NtkCleanMarkA(pNtk);
  return;
}

Assistant:

void Abc_NtkPrintStrSupports( Abc_Ntk_t * pNtk, int fMatrix )
{
    Vec_Ptr_t * vSupp, * vNodes;
    Abc_Obj_t * pObj;
    int i, k, nPis;
    printf( "Structural support info:\n" );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vSupp  = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        vNodes = Abc_NtkDfsNodes( pNtk, &pObj, 1 );
        nPis   = Abc_NtkCountPis( vSupp );
        printf( "%5d  %20s :  Cone = %5d.  Supp = %5d. (PIs = %5d. FFs = %5d.)\n",
            i, Abc_ObjName(pObj), vNodes->nSize, vSupp->nSize, nPis, vSupp->nSize - nPis );
        Vec_PtrFree( vNodes );
        Vec_PtrFree( vSupp );
    }
    if ( !fMatrix )
    {
        Abc_NtkCleanMarkA( pNtk );
        return;
    }

    Abc_NtkForEachCi( pNtk, pObj, k )
        pObj->fMarkA = 0;

    printf( "Actual support info:\n" );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vSupp  = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, k )
            pObj->fMarkA = 1;
        Vec_PtrFree( vSupp );

        Abc_NtkForEachCi( pNtk, pObj, k )
            printf( "%d", pObj->fMarkA );
        printf( "\n" );

        Abc_NtkForEachCi( pNtk, pObj, k )
            pObj->fMarkA = 0;
    }
    Abc_NtkCleanMarkA( pNtk );
}